

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

BattleWithLandlord * __thiscall
BattleWithLandlord::operator=(BattleWithLandlord *this,BattleWithLandlord *that)

{
  BattleWithLandlord *in_RSI;
  BattleWithLandlord *in_RDI;
  
  if (in_RDI != in_RSI) {
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::operator=
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)in_RSI,
               (multiset<char,_std::less<char>,_std::allocator<char>_> *)in_RDI);
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::operator=
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)in_RSI,
               (multiset<char,_std::less<char>,_std::allocator<char>_> *)in_RDI);
    CardStyle::operator=((CardStyle *)in_RSI,(CardStyle *)in_RDI);
    in_RDI->_round = in_RSI->_round;
    in_RDI->_side = in_RSI->_side;
    in_RDI->_ready = true;
    in_RDI->_stopsearch = false;
  }
  return in_RDI;
}

Assistant:

BattleWithLandlord& BattleWithLandlord::operator=(const BattleWithLandlord &that) {
    if (this != &that) {
        _cards[0] = that._cards[0];
        _cards[1] = that._cards[1];
        _last = that._last;
        _round = that._round;
        _side = that._side;
        _ready = true;
        _stopsearch = false;
    }
    return *this;
}